

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_image_draw_rectangle(rf_image *dst,rf_rec rec,rf_color color,rf_allocator temp_allocator)

{
  rf_image src_00;
  rf_image image;
  undefined1 auVar1 [16];
  rf_rec src_rec;
  rf_image src;
  rf_image *dst_local;
  rf_allocator temp_allocator_local;
  rf_color color_local;
  rf_rec rec_local;
  
  rec_local.x = rec.width;
  rec_local.y = rec.height;
  if ((dst->valid & 1U) != 0) {
    dst->valid = false;
    rf_gen_image_color((rf_image *)&src_rec.width,(int)rec_local.x,(int)rec_local.y,color,
                       temp_allocator);
    if ((src.height & 1U) != 0) {
      src_rec.x = rec_local.x;
      src_rec.y = rec_local.y;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = rec._8_8_;
      src_00._20_4_ = src.height;
      src_00.format = src.width;
      src_00._8_8_ = src.data;
      src_00.data = (void *)src_rec._8_8_;
      rf_image_draw(dst,src_00,(rf_rec)(auVar1 << 0x40),rec,(rf_color)0xffffffff,temp_allocator);
      image._20_4_ = src.height;
      image.format = src.width;
      image._8_8_ = src.data;
      image.data = (void *)src_rec._8_8_;
      rf_unload_image(image,temp_allocator);
    }
  }
  return;
}

Assistant:

RF_API void rf_image_draw_rectangle(rf_image* dst, rf_rec rec, rf_color color, rf_allocator temp_allocator)
{
    if (dst->valid)
    {
        dst->valid = false;

        rf_image src = rf_gen_image_color((int)rec.width, (int)rec.height, color, temp_allocator);

        if (src.valid)
        {
            rf_rec src_rec = (rf_rec){ 0, 0, rec.width, rec.height };

            rf_image_draw(dst, src, src_rec, rec, RF_WHITE, temp_allocator);

            rf_unload_image(src, temp_allocator);
        }
    }
}